

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.hpp
# Opt level: O0

void __thiscall
units::uncertain_measurement::uncertain_measurement
          (uncertain_measurement *this,measurement *val,measurement *uncertainty_meas)

{
  measurement *this_00;
  unit uVar1;
  double dVar2;
  unit local_28;
  measurement *local_20;
  measurement *uncertainty_meas_local;
  measurement *val_local;
  uncertain_measurement *this_local;
  
  local_20 = uncertainty_meas;
  uncertainty_meas_local = val;
  val_local = (measurement *)this;
  dVar2 = measurement::value(val);
  this_00 = local_20;
  this->value_ = (float)dVar2;
  local_28 = measurement::units(uncertainty_meas_local);
  dVar2 = measurement::value_as(this_00,&local_28);
  this->uncertainty_ = (float)dVar2;
  uVar1 = measurement::units(uncertainty_meas_local);
  this->units_ = uVar1;
  return;
}

Assistant:

explicit uncertain_measurement(
        const measurement& val,
        const measurement& uncertainty_meas) noexcept :
        value_(static_cast<float>(val.value())),
        uncertainty_(
            static_cast<float>(uncertainty_meas.value_as(val.units()))),
        units_(val.units())
    {
    }